

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memleak.cc
# Opt level: O2

void * memleak_realloc(void *ptr,size_t size)

{
  void *addr;
  avl_node *node;
  memleak_item query;
  avl_node local_38;
  
  addr = realloc(ptr,size);
  if ((addr != (void *)0x0) && ((start_sw & 1) != 0)) {
    pthread_spin_lock(&lock);
    node = avl_search(&tree_index,&local_38,memleak_cmp);
    if (node != (avl_node *)0x0) {
      avl_remove(&tree_index,node);
      _memleak_add_to_index(addr,size,(char *)node[-1].parent,(size_t)node[-1].right,'\0');
      free(&node[-2].right);
    }
    pthread_spin_unlock(&lock);
  }
  return addr;
}

Assistant:

LIBMEMLEAK_API
void *memleak_realloc(void *ptr, size_t size)
{

    void *addr = (void *)realloc(ptr, size);
    if (addr && start_sw) {
        spin_lock(&lock);
        struct avl_node *a;
        struct memleak_item *item, query;

        query.addr = (uint64_t)ptr;
        a = avl_search(&tree_index, &query.avl, memleak_cmp);
        if (a) {
            item = _get_entry(a, struct memleak_item, avl);
            DBG("realloc from address 0x%016lx (allocated at %s:%ld, size %ld)\n\tto address 0x%016lx (size %ld)\n",
                item->addr, item->file, item->line, item->size, (uint64_t)addr, size);
            avl_remove(&tree_index, a);
            _memleak_add_to_index(addr, size, item->file, item->line, 0);
#ifdef _STACK_BACKTRACE
            free(item->btrace);
#endif
            free(item);
        }
        spin_unlock(&lock);
    }

    return addr;
}